

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

int WebRtcIsac_DecodeLb(TransformTables *transform_tables,float *signal_out,
                       ISACLBDecStruct *ISACdecLB_obj,int16_t *current_framesamples,
                       int16_t isRCUPayload)

{
  int iVar1;
  long lVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  short sVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int16_t PitchGains_Q12 [4];
  int16_t bandwidthInd;
  PostFiltBankstr *local_3190;
  float *local_3188;
  float *local_3180;
  float *local_3178;
  float *local_3170;
  PitchFiltstr *local_3168;
  FFTstr *local_3160;
  ulong local_3158;
  TransformTables *local_3150;
  float *local_3148;
  ulong local_3140;
  double PitchLags [4];
  double PitchGains [4];
  double hi_filt_coef [42];
  double lo_filt_coef [78];
  double LPw_pf [240];
  double HPw [240];
  double LPw [240];
  float HP_dec_float [240];
  float LP_dec_float [240];
  double imag_f [240];
  double real_f [240];
  
  local_3150 = transform_tables;
  local_3148 = signal_out;
  WebRtcIsac_ResetBitstream(&ISACdecLB_obj->bitstr_obj);
  iVar1 = WebRtcIsac_DecodeFrameLen(&ISACdecLB_obj->bitstr_obj,current_framesamples);
  if (-1 < iVar1) {
    sVar6 = *current_framesamples;
    iVar1 = WebRtcIsac_DecodeSendBW(&ISACdecLB_obj->bitstr_obj,&bandwidthInd);
    if (-1 < iVar1) {
      local_3160 = &ISACdecLB_obj->fftstr_obj;
      local_3168 = &ISACdecLB_obj->pitchfiltstr_obj;
      local_3170 = (ISACdecLB_obj->maskfiltstr_obj).PostStateLoF;
      local_3178 = (ISACdecLB_obj->maskfiltstr_obj).PostStateLoG;
      local_3180 = (ISACdecLB_obj->maskfiltstr_obj).PostStateHiF;
      local_3188 = (ISACdecLB_obj->maskfiltstr_obj).PostStateHiG;
      sVar3 = -1;
      if (-1 < sVar6 / 0x3c0) {
        sVar3 = sVar6 / 0x3c0;
      }
      local_3190 = &ISACdecLB_obj->postfiltbankstr_obj;
      local_3158 = (ulong)(ushort)(sVar3 + 1);
      uVar9 = 0;
      iVar1 = 0;
      while( true ) {
        if (((uVar9 == local_3158) ||
            (iVar1 = WebRtcIsac_DecodePitchGain(&ISACdecLB_obj->bitstr_obj,PitchGains_Q12),
            iVar1 < 0)) ||
           (iVar1 = WebRtcIsac_DecodePitchLag(&ISACdecLB_obj->bitstr_obj,PitchGains_Q12,PitchLags),
           iVar1 < 0)) break;
        iVar4 = (int)PitchGains_Q12[0];
        iVar5 = (int)PitchGains_Q12[1];
        iVar7 = (int)PitchGains_Q12[2];
        iVar8 = (int)PitchGains_Q12[3];
        local_3140 = uVar9;
        iVar1 = WebRtcIsac_DecodeLpc(&ISACdecLB_obj->bitstr_obj,lo_filt_coef,hi_filt_coef);
        if (iVar1 < 0) {
          return iVar1;
        }
        sVar6 = (short)((uint)(iVar7 + iVar8 + iVar5 + iVar4) >> 2);
        iVar1 = WebRtcIsac_DecodeSpec(&ISACdecLB_obj->bitstr_obj,sVar6,kIsacLowerBand,real_f,imag_f)
        ;
        if (iVar1 < 0) {
          return iVar1;
        }
        WebRtcIsac_Spec2time(local_3150,real_f,imag_f,LPw,HPw,local_3160);
        uVar9 = local_3140;
        for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
          PitchGains[lVar2] = (double)((float)(int)PitchGains_Q12[lVar2] * 0.00024414062);
        }
        if (isRCUPayload != 0) {
          for (lVar2 = 0; lVar2 != 0xf0; lVar2 = lVar2 + 1) {
            LPw[lVar2] = LPw[lVar2] * 2.5;
            HPw[lVar2] = HPw[lVar2] * 2.5;
          }
        }
        WebRtcIsac_PitchfilterPost(LPw,LPw_pf,local_3168,PitchLags,PitchGains);
        for (lVar2 = 0; lVar2 != 0xf0; lVar2 = lVar2 + 1) {
          LPw_pf[lVar2] = LPw_pf[lVar2] * (double)((float)(int)sVar6 * 0.00024414062 * -0.45 + 1.0);
        }
        if (isRCUPayload != 0) {
          for (lVar2 = 0; lVar2 != 0xf0; lVar2 = lVar2 + 1) {
            LPw_pf[lVar2] = LPw_pf[lVar2] * 0.4000000059604645;
            HPw[lVar2] = HPw[lVar2] * 0.4000000059604645;
          }
        }
        WebRtcIsac_NormLatticeFilterAr(0xc,local_3170,local_3178,LPw_pf,lo_filt_coef,LP_dec_float);
        WebRtcIsac_NormLatticeFilterAr(6,local_3180,local_3188,HPw,hi_filt_coef,HP_dec_float);
        WebRtcIsac_FilterAndCombineFloat
                  (LP_dec_float,HP_dec_float,local_3148 + uVar9 * 0x1e0,local_3190);
        uVar9 = uVar9 + 1;
      }
    }
  }
  return iVar1;
}

Assistant:

int WebRtcIsac_DecodeLb(const TransformTables* transform_tables,
                        float* signal_out, ISACLBDecStruct* ISACdecLB_obj,
                        int16_t* current_framesamples,
                        int16_t isRCUPayload) {
  int k;
  int len, err;
  int16_t bandwidthInd;

  float LP_dec_float[FRAMESAMPLES_HALF];
  float HP_dec_float[FRAMESAMPLES_HALF];

  double LPw[FRAMESAMPLES_HALF];
  double HPw[FRAMESAMPLES_HALF];
  double LPw_pf[FRAMESAMPLES_HALF];

  double lo_filt_coef[(ORDERLO + 1)*SUBFRAMES];
  double hi_filt_coef[(ORDERHI + 1)*SUBFRAMES];

  double real_f[FRAMESAMPLES_HALF];
  double imag_f[FRAMESAMPLES_HALF];

  double PitchLags[4];
  double PitchGains[4];
  double AvgPitchGain;
  int16_t PitchGains_Q12[4];
  int16_t AvgPitchGain_Q12;

  float gain;

  int frame_nb; /* counter */
  int frame_mode; /* 0 30ms, 1 for 60ms */
  /* Processed_samples: 480 (30, 60 ms). Cannot take other values. */

  WebRtcIsac_ResetBitstream(&(ISACdecLB_obj->bitstr_obj));

  len = 0;

  /* Decode framelength and BW estimation - not used,
     only for stream pointer*/
  err = WebRtcIsac_DecodeFrameLen(&ISACdecLB_obj->bitstr_obj,
                                  current_framesamples);
  if (err < 0) {
    return err;
  }

  /* Frame_mode:
   * 0: indicates 30 ms frame (480 samples)
   * 1: indicates 60 ms frame (960 samples) */
  frame_mode = *current_framesamples / MAX_FRAMESAMPLES;

  err = WebRtcIsac_DecodeSendBW(&ISACdecLB_obj->bitstr_obj, &bandwidthInd);
  if (err < 0) {
    return err;
  }

  /* One loop if it's one frame (20 or 30ms), 2 loops if 2 frames
     bundled together (60ms). */
  for (frame_nb = 0; frame_nb <= frame_mode; frame_nb++) {
    /* Decode & de-quantize pitch parameters */
    err = WebRtcIsac_DecodePitchGain(&ISACdecLB_obj->bitstr_obj,
                                     PitchGains_Q12);
    if (err < 0) {
      return err;
    }

    err = WebRtcIsac_DecodePitchLag(&ISACdecLB_obj->bitstr_obj, PitchGains_Q12,
                                    PitchLags);
    if (err < 0) {
      return err;
    }

    AvgPitchGain_Q12 = (PitchGains_Q12[0] + PitchGains_Q12[1] +
        PitchGains_Q12[2] + PitchGains_Q12[3]) >> 2;

    /* Decode & de-quantize filter coefficients. */
    err = WebRtcIsac_DecodeLpc(&ISACdecLB_obj->bitstr_obj, lo_filt_coef,
                               hi_filt_coef);
    if (err < 0) {
      return err;
    }
    /* Decode & de-quantize spectrum. */
    len = WebRtcIsac_DecodeSpec(&ISACdecLB_obj->bitstr_obj, AvgPitchGain_Q12,
                                kIsacLowerBand, real_f, imag_f);
    if (len < 0) {
      return len;
    }

    /* Inverse transform. */
    WebRtcIsac_Spec2time(transform_tables, real_f, imag_f, LPw, HPw,
                         &ISACdecLB_obj->fftstr_obj);

    /* Convert PitchGains back to float for pitchfilter_post */
    for (k = 0; k < 4; k++) {
      PitchGains[k] = ((float)PitchGains_Q12[k]) / 4096;
    }
    if (isRCUPayload) {
      for (k = 0; k < 240; k++) {
        LPw[k] *= RCU_TRANSCODING_SCALE_INVERSE;
        HPw[k] *= RCU_TRANSCODING_SCALE_INVERSE;
      }
    }

    /* Inverse pitch filter. */
    WebRtcIsac_PitchfilterPost(LPw, LPw_pf, &ISACdecLB_obj->pitchfiltstr_obj,
                               PitchLags, PitchGains);
    /* Convert AvgPitchGain back to float for computation of gain. */
    AvgPitchGain = ((float)AvgPitchGain_Q12) / 4096;
    gain = 1.0f - 0.45f * (float)AvgPitchGain;

    for (k = 0; k < FRAMESAMPLES_HALF; k++) {
      /* Reduce gain to compensate for pitch enhancer. */
      LPw_pf[k] *= gain;
    }

    if (isRCUPayload) {
      for (k = 0; k < FRAMESAMPLES_HALF; k++) {
        /* Compensation for transcoding gain changes. */
        LPw_pf[k] *= RCU_TRANSCODING_SCALE;
        HPw[k] *= RCU_TRANSCODING_SCALE;
      }
    }
    /* Perceptual post-filtering (using normalized lattice filter). */
    WebRtcIsac_NormLatticeFilterAr(
        ORDERLO, ISACdecLB_obj->maskfiltstr_obj.PostStateLoF,
        (ISACdecLB_obj->maskfiltstr_obj).PostStateLoG, LPw_pf, lo_filt_coef,
        LP_dec_float);
    WebRtcIsac_NormLatticeFilterAr(
        ORDERHI, ISACdecLB_obj->maskfiltstr_obj.PostStateHiF,
        (ISACdecLB_obj->maskfiltstr_obj).PostStateHiG, HPw, hi_filt_coef,
        HP_dec_float);

    /* Recombine the 2 bands. */
    WebRtcIsac_FilterAndCombineFloat(LP_dec_float, HP_dec_float,
                                     signal_out + frame_nb * FRAMESAMPLES,
                                     &ISACdecLB_obj->postfiltbankstr_obj);
  }
  return len;
}